

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O3

void ggml_backend_load_all_from_path(char *dir_path)

{
  char *pcVar1;
  char *in_RDX;
  char *user_search_path;
  char *user_search_path_00;
  char *user_search_path_01;
  char *user_search_path_02;
  char *user_search_path_03;
  char *user_search_path_04;
  char *user_search_path_05;
  char *user_search_path_06;
  char *user_search_path_07;
  char *user_search_path_08;
  char *user_search_path_09;
  bool silent;
  char *in_stack_00000008;
  
  silent = SUB81(dir_path,0);
  ggml_backend_load_best("blas",silent,in_RDX);
  ggml_backend_load_best("cann",silent,user_search_path);
  ggml_backend_load_best("cuda",silent,user_search_path_00);
  ggml_backend_load_best("hip",silent,user_search_path_01);
  ggml_backend_load_best("kompute",silent,user_search_path_02);
  ggml_backend_load_best("metal",silent,user_search_path_03);
  ggml_backend_load_best("rpc",silent,user_search_path_04);
  ggml_backend_load_best("sycl",silent,user_search_path_05);
  ggml_backend_load_best("vulkan",silent,user_search_path_06);
  ggml_backend_load_best("opencl",silent,user_search_path_07);
  ggml_backend_load_best("musa",silent,user_search_path_08);
  ggml_backend_load_best("cpu",silent,user_search_path_09);
  pcVar1 = getenv("GGML_BACKEND_PATH");
  if (pcVar1 != (char *)0x0) {
    ggml_backend_load(in_stack_00000008);
    return;
  }
  return;
}

Assistant:

void ggml_backend_load_all_from_path(const char * dir_path) {
#ifdef NDEBUG
    bool silent = true;
#else
    bool silent = false;
#endif

    ggml_backend_load_best("blas", silent, dir_path);
    ggml_backend_load_best("cann", silent, dir_path);
    ggml_backend_load_best("cuda", silent, dir_path);
    ggml_backend_load_best("hip", silent, dir_path);
    ggml_backend_load_best("kompute", silent, dir_path);
    ggml_backend_load_best("metal", silent, dir_path);
    ggml_backend_load_best("rpc", silent, dir_path);
    ggml_backend_load_best("sycl", silent, dir_path);
    ggml_backend_load_best("vulkan", silent, dir_path);
    ggml_backend_load_best("opencl", silent, dir_path);
    ggml_backend_load_best("musa", silent, dir_path);
    ggml_backend_load_best("cpu", silent, dir_path);
    // check the environment variable GGML_BACKEND_PATH to load an out-of-tree backend
    const char * backend_path = std::getenv("GGML_BACKEND_PATH");
    if (backend_path) {
        ggml_backend_load(backend_path);
    }
}